

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool imageExists(string *rootDir,string *imageId)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  pointer pIVar4;
  long lVar5;
  pointer pIVar6;
  undefined1 auVar7 [8];
  undefined1 local_120 [8];
  vector<Image,_std::allocator<Image>_> images;
  long *local_100;
  long local_f8;
  long local_f0 [2];
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90 [2];
  long *local_80;
  long local_78;
  long local_70 [2];
  long *local_60;
  size_t local_58;
  long local_50 [2];
  pointer local_40;
  long *local_38;
  
  getContainerImages((vector<Image,_std::allocator<Image>_> *)local_120,rootDir);
  local_80 = local_70;
  pcVar1 = (imageId->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + imageId->_M_string_length);
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_80,local_78 + (long)local_80);
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c0,local_a0,local_98 + (long)local_a0);
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e0,local_c0,local_b8 + (long)local_c0);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_e0,local_d8 + (long)local_e0);
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_100,local_60,local_58 + (long)local_60)
  ;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_100,local_f8 + (long)local_100);
  local_38 = local_60;
  lVar3 = (long)images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                super__Vector_impl_data._M_start - (long)local_120;
  lVar5 = (lVar3 >> 3) * -0x71c71c71c71c71c7 >> 2;
  local_40 = images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
             super__Vector_impl_data._M_start;
  auVar7 = local_120;
  if (0 < lVar5) {
    images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)((long)local_120 + lVar5 * 4 * 0x48);
    lVar5 = lVar5 + 1;
    pIVar6 = (pointer)((long)local_120 + 0x90);
    do {
      if (pIVar6[-2].id._M_string_length == local_58) {
        if (local_58 == 0) {
          pIVar4 = pIVar6 + -2;
          goto LAB_0010c132;
        }
        iVar2 = bcmp(pIVar6[-2].id._M_dataplus._M_p,local_38,local_58);
        pIVar4 = (pointer)auVar7;
        if (iVar2 == 0) goto LAB_0010c132;
        if (pIVar6[-1].id._M_string_length == local_58) {
          pIVar4 = pIVar6 + -1;
          goto LAB_0010bfd2;
        }
      }
      else if (pIVar6[-1].id._M_string_length == local_58) {
        if (local_58 == 0) {
          pIVar4 = pIVar6 + -1;
          goto LAB_0010c132;
        }
        pIVar4 = (pointer)((long)auVar7 + 0x48);
LAB_0010bfd2:
        iVar2 = bcmp((pIVar4->id)._M_dataplus._M_p,local_38,local_58);
        if (iVar2 == 0) goto LAB_0010c132;
      }
      if ((pIVar6->id)._M_string_length == local_58) {
        pIVar4 = pIVar6;
        if ((local_58 == 0) ||
           (iVar2 = bcmp((pIVar6->id)._M_dataplus._M_p,local_38,local_58), iVar2 == 0))
        goto LAB_0010c132;
        if (pIVar6[1].id._M_string_length == local_58) {
          pIVar4 = pIVar6 + 1;
          goto LAB_0010c032;
        }
      }
      else if (pIVar6[1].id._M_string_length == local_58) {
        if (local_58 == 0) {
          pIVar4 = pIVar6 + 1;
          goto LAB_0010c132;
        }
        pIVar4 = (pointer)((long)auVar7 + 0xd8);
LAB_0010c032:
        iVar2 = bcmp((pIVar4->id)._M_dataplus._M_p,local_38,local_58);
        if (iVar2 == 0) goto LAB_0010c132;
      }
      auVar7 = (undefined1  [8])((long)auVar7 + 0x120);
      lVar5 = lVar5 + -1;
      pIVar6 = pIVar6 + 4;
    } while (1 < lVar5);
    lVar3 = (long)local_40 -
            (long)images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    auVar7 = (undefined1  [8])
             images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  lVar3 = (lVar3 >> 3) * -0x71c71c71c71c71c7;
  pIVar6 = local_40;
  if (lVar3 != 1) {
    pIVar4 = (pointer)auVar7;
    if (lVar3 != 2) {
      pIVar4 = local_40;
      if ((lVar3 != 3) ||
         (((((pointer)auVar7)->id)._M_string_length == local_58 &&
          ((pIVar4 = (pointer)auVar7, local_58 == 0 ||
           (iVar2 = bcmp((((pointer)auVar7)->id)._M_dataplus._M_p,local_38,local_58), iVar2 == 0))))
         )) goto LAB_0010c132;
      pIVar4 = (pointer)((long)auVar7 + 0x48);
    }
    pIVar6 = local_40;
    if (((pIVar4->id)._M_string_length == local_58) &&
       ((local_58 == 0 ||
        (iVar2 = bcmp((pIVar4->id)._M_dataplus._M_p,local_38,local_58), iVar2 == 0))))
    goto LAB_0010c132;
    auVar7 = (undefined1  [8])(pIVar4 + 1);
  }
  pIVar4 = pIVar6;
  if ((((((pointer)auVar7)->id)._M_string_length == local_58) &&
      (pIVar4 = (pointer)auVar7, local_58 != 0)) &&
     (iVar2 = bcmp((((pointer)auVar7)->id)._M_dataplus._M_p,local_38,local_58), iVar2 != 0)) {
    pIVar4 = local_40;
  }
LAB_0010c132:
  if (local_38 != local_50) {
    operator_delete(local_38,local_50[0] + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  pIVar6 = local_40;
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  std::vector<Image,_std::allocator<Image>_>::~vector
            ((vector<Image,_std::allocator<Image>_> *)local_120);
  return pIVar4 != pIVar6;
}

Assistant:

bool imageExists(const std::string& rootDir, const std::string& imageId)
{
    auto images = getContainerImages(rootDir);
    return std::any_of(images.cbegin(), images.cend(),
                       [imageId](const Image& image) { return image.id == imageId; });
}